

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

uint Js::FunctionBody::GetReducedLoopInterpretCount(void)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar3 = DAT_0143ef08;
  bVar1 = ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Configuration::Global,LoopInterpretCountFlag);
  if (!bVar1) {
    uVar2 = uVar3 / 3;
    uVar4 = (DAT_01441e6c ^ 1) * 9 + 0x10;
    uVar5 = uVar3;
    if (uVar4 < uVar3) {
      uVar5 = uVar4;
    }
    uVar3 = uVar2;
    if (uVar2 <= uVar5) {
      uVar3 = uVar5;
    }
  }
  return uVar3;
}

Assistant:

uint FunctionBody::GetReducedLoopInterpretCount()
    {
        const uint loopInterpretCount = CONFIG_FLAG(LoopInterpretCount);
        if(CONFIG_ISENABLED(LoopInterpretCountFlag))
        {
            return loopInterpretCount;
        }
        return max(loopInterpretCount / 3, GetMinLoopProfileIterations(loopInterpretCount));
    }